

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_network.cpp
# Opt level: O3

void __thiscall
neural_networks::NeuralNetwork::NeuralNetwork
          (NeuralNetwork *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *dimensions,
          string *new_label,longdouble rate)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  NeuralLayer *pNVar3;
  pointer puVar4;
  ulong uVar5;
  allocator_type local_99;
  vector<neural_networks::utilities::NeuralLayer_*,_std::allocator<neural_networks::utilities::NeuralLayer_*>_>
  *local_98;
  longdouble local_90;
  string *local_80;
  string local_78;
  string local_58;
  value_type local_38;
  
  local_90 = rate;
  this->_vptr_NeuralNetwork = (_func_int **)&PTR_set_data_0010bd38;
  local_98 = &this->layers;
  local_38 = (value_type)0x0;
  std::
  vector<neural_networks::utilities::NeuralLayer_*,_std::allocator<neural_networks::utilities::NeuralLayer_*>_>
  ::vector(local_98,(long)(dimensions->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_finish -
                    (long)(dimensions->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_start >> 3,&local_38,&local_99);
  this->learning_rate = local_90;
  paVar1 = &(this->label).field_2;
  local_90 = (longdouble)CONCAT28(local_90._8_2_,paVar1);
  (this->label)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (new_label->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->label,pcVar2,pcVar2 + new_label->_M_string_length);
  local_80 = &this->label;
  pNVar3 = (NeuralLayer *)operator_new(0x50);
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  utilities::NeuralLayer::NeuralLayer
            (pNVar3,*(dimensions->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                     ._M_impl.super__Vector_impl_data._M_start,0,&local_58);
  *(local_98->
   super__Vector_base<neural_networks::utilities::NeuralLayer_*,_std::allocator<neural_networks::utilities::NeuralLayer_*>_>
   )._M_impl.super__Vector_impl_data._M_start = pNVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  puVar4 = (dimensions->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (8 < (ulong)((long)(dimensions->
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar4)) {
    uVar5 = 1;
    do {
      pNVar3 = (NeuralLayer *)operator_new(0x50);
      local_78._M_string_length = 0;
      local_78.field_2._M_local_buf[0] = '\0';
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      utilities::NeuralLayer::NeuralLayer(pNVar3,puVar4[uVar5],puVar4[uVar5 - 1],&local_78);
      (local_98->
      super__Vector_base<neural_networks::utilities::NeuralLayer_*,_std::allocator<neural_networks::utilities::NeuralLayer_*>_>
      )._M_impl.super__Vector_impl_data._M_start[uVar5] = pNVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      uVar5 = uVar5 + 1;
      puVar4 = (dimensions->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(dimensions->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 3))
    ;
  }
  return;
}

Assistant:

NeuralNetwork::NeuralNetwork(const std::vector<size_t>& dimensions, std::string new_label, long double rate) :
        layers(dimensions.size(), nullptr), label(new_label), learning_rate(rate) {
    layers[0] = new utilities::NeuralLayer(dimensions[0], 0);
    for(register size_t i = 1; i < dimensions.size(); ++i) {
        layers[i] = new utilities::NeuralLayer(dimensions[i], dimensions[i - 1]);
    }
}